

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.h
# Opt level: O3

void __thiscall
kj::Function<void_(kj::AsyncIoProvider_&,_kj::AsyncIoStream_&,_kj::WaitScope_&)>::
Impl<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io-test.c++:242:7)>
::operator()(Impl<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_async_io_test_c__:242:7)>
             *this,AsyncIoProvider *params,AsyncIoStream *params_1,WaitScope *params_2)

{
  PromiseNode *pPVar1;
  short *psVar2;
  undefined8 uVar3;
  __pid_t _Var4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  bool bVar5;
  char buf [4];
  char local_1b0 [4];
  uint local_1ac;
  Own<kj::_::PromiseNode> local_1a8;
  short *local_198;
  anon_union_344_1_a8c68091_for_NullableValue<kj::Exception>_2 aStack_190;
  char local_38;
  
  (**(params_1->super_AsyncOutputStream)._vptr_AsyncOutputStream)
            (&local_1a8,&params_1->super_AsyncOutputStream,"foo",3);
  local_198 = (short *)((ulong)local_198 & 0xffffffffffffff00);
  local_38 = '\0';
  _::waitImpl(&local_1a8,(ExceptionOrValue *)&local_198,params_2);
  if (local_38 == '\x01') {
    if (local_198._0_1_ != false) {
      throwRecoverableException((Exception *)&aStack_190,0);
    }
  }
  else {
    if (local_198._0_1_ == false) {
      _::unreachable();
    }
    throwRecoverableException((Exception *)&aStack_190,0);
  }
  if (local_198._0_1_ == true) {
    Exception::~Exception((Exception *)&aStack_190);
  }
  pPVar1 = local_1a8.ptr;
  if (local_1a8.ptr != (PromiseNode *)0x0) {
    local_1a8.ptr = (PromiseNode *)0x0;
    (**(local_1a8.disposer)->_vptr_Disposer)
              (local_1a8.disposer,
               (_func_int *)((long)&pPVar1->_vptr_PromiseNode + (long)pPVar1->_vptr_PromiseNode[-2])
              );
  }
  (*(params_1->super_AsyncInputStream)._vptr_AsyncInputStream[1])
            ((ExceptionOrValue *)&local_198,params_1,local_1b0,3,4);
  _Var4 = Promise<unsigned_long>::wait((Promise<unsigned_long> *)&local_198,params_2);
  uVar3 = aStack_190.value.ownFile.content.ptr;
  if ((long *)aStack_190.value.ownFile.content.ptr != (long *)0x0) {
    aStack_190.value.ownFile.content.ptr = (char *)0x0;
    (*(code *)**(undefined8 **)local_198)
              (local_198,(char *)(uVar3 + *(long *)(*(long *)uVar3 + -0x10)));
  }
  if ((CONCAT44(extraout_var,_Var4) != 3) && (_::Debug::minSeverity < 3)) {
    local_1ac = 3;
    (*(params_1->super_AsyncInputStream)._vptr_AsyncInputStream[1])
              ((ExceptionOrValue *)&local_198,params_1,local_1b0,3,4);
    _Var4 = Promise<unsigned_long>::wait((Promise<unsigned_long> *)&local_198,params_2);
    local_1a8.disposer = (Disposer *)CONCAT44(extraout_var_00,_Var4);
    _::Debug::log<char_const(&)[69],unsigned_int,unsigned_long>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io-test.c++"
               ,0xf5,ERROR,
               "\"failed: expected \" \"(3u) == (stream.tryRead(buf, 3, 4).wait(waitScope))\", 3u, stream.tryRead(buf, 3, 4).wait(waitScope)"
               ,(char (*) [69])
                "failed: expected (3u) == (stream.tryRead(buf, 3, 4).wait(waitScope))",&local_1ac,
               (unsigned_long *)&local_1a8);
    uVar3 = aStack_190.value.ownFile.content.ptr;
    if ((long *)aStack_190.value.ownFile.content.ptr != (long *)0x0) {
      aStack_190.value.ownFile.content.ptr = (char *)0x0;
      (*(code *)**(undefined8 **)local_198)
                (local_198,(char *)(uVar3 + *(long *)(*(long *)uVar3 + -0x10)));
    }
  }
  heapString((String *)&local_198,local_1b0,3);
  uVar3 = aStack_190.value.ownFile.content.ptr;
  psVar2 = local_198;
  bVar5 = true;
  if ((long *)aStack_190.value.ownFile.content.ptr == (long *)0x4) {
    bVar5 = (char)local_198[1] != 'r' || *local_198 != 0x6162;
  }
  if (local_198 != (short *)0x0) {
    local_198 = (short *)0x0;
    aStack_190.value.ownFile.content.ptr = (char *)0x0;
    (*(code *)**(undefined8 **)aStack_190.value.ownFile.content.size_)
              (aStack_190.value.ownFile.content.size_,psVar2,1,uVar3,uVar3,0);
  }
  if ((bool)(bVar5 & _::Debug::minSeverity < 3)) {
    heapString((String *)&local_198,local_1b0,3);
    _::Debug::log<char_const(&)[49],char_const(&)[4],kj::String>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io-test.c++"
               ,0xf6,ERROR,
               "\"failed: expected \" \"(\\\"bar\\\") == (heapString(buf, 3))\", \"bar\", heapString(buf, 3)"
               ,(char (*) [49])"failed: expected (\"bar\") == (heapString(buf, 3))",
               (char (*) [4])0x370438,(String *)&local_198);
    uVar3 = aStack_190.value.ownFile.content.ptr;
    psVar2 = local_198;
    if (local_198 != (short *)0x0) {
      local_198 = (short *)0x0;
      aStack_190.value.ownFile.content.ptr = (char *)0x0;
      (*(code *)**(undefined8 **)aStack_190.value.ownFile.content.size_)
                (aStack_190.value.ownFile.content.size_,psVar2,1,uVar3,uVar3,0);
    }
  }
  (*(params_1->super_AsyncInputStream)._vptr_AsyncInputStream[1])
            ((ExceptionOrValue *)&local_198,params_1,local_1b0,1,1);
  _Var4 = Promise<unsigned_long>::wait((Promise<unsigned_long> *)&local_198,params_2);
  uVar3 = aStack_190.value.ownFile.content.ptr;
  if ((long *)aStack_190.value.ownFile.content.ptr != (long *)0x0) {
    aStack_190.value.ownFile.content.ptr = (char *)0x0;
    (*(code *)**(undefined8 **)local_198)
              (local_198,(char *)(uVar3 + *(long *)(*(long *)uVar3 + -0x10)));
  }
  if ((CONCAT44(extraout_var_01,_Var4) != 0) && (_::Debug::minSeverity < 3)) {
    local_1ac = 0;
    (*(params_1->super_AsyncInputStream)._vptr_AsyncInputStream[1])
              ((ExceptionOrValue *)&local_198,params_1,local_1b0,1,1);
    _Var4 = Promise<unsigned_long>::wait((Promise<unsigned_long> *)&local_198,params_2);
    local_1a8.disposer = (Disposer *)CONCAT44(extraout_var_02,_Var4);
    _::Debug::log<char_const(&)[68],int,unsigned_long>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io-test.c++"
               ,0xf9,ERROR,
               "\"failed: expected \" \"(0) == (stream.tryRead(buf, 1, 1).wait(waitScope))\", 0, stream.tryRead(buf, 1, 1).wait(waitScope)"
               ,(char (*) [68])"failed: expected (0) == (stream.tryRead(buf, 1, 1).wait(waitScope))"
               ,(int *)&local_1ac,(unsigned_long *)&local_1a8);
    uVar3 = aStack_190.value.ownFile.content.ptr;
    if ((long *)aStack_190.value.ownFile.content.ptr != (long *)0x0) {
      aStack_190.value.ownFile.content.ptr = (char *)0x0;
      (*(code *)**(undefined8 **)local_198)
                (local_198,(char *)(uVar3 + *(long *)(*(long *)uVar3 + -0x10)));
    }
  }
  return;
}

Assistant:

Return operator()(Params... params) override {
      return f(kj::fwd<Params>(params)...);
    }